

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

void capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::set
               (PointerBuilder builder,Reader *value)

{
  DebugExpression<bool> _kjCondition;
  Fault f;
  void *local_30;
  uint local_20;
  
  Schema::getProto((Reader *)&f,(Schema *)value);
  if (local_20 < 0xe1) {
    _kjCondition.value = true;
  }
  else {
    _kjCondition.value = (bool)(*(byte *)((long)local_30 + 0x1c) & 1 ^ 1);
    if ((*(byte *)((long)local_30 + 0x1c) & 1) != 0) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[35]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x77d,FAILED,"!value.schema.getProto().getStruct().getIsGroup()",
                 "_kjCondition,\"Cannot form pointer to group type.\"",&_kjCondition,
                 (char (*) [35])"Cannot form pointer to group type.");
      kj::_::Debug::Fault::fatal(&f);
    }
  }
  PointerBuilder::setStruct(&builder,&value->reader,false);
  return;
}

Assistant:

void PointerHelpers<DynamicStruct, Kind::OTHER>::set(
    PointerBuilder builder, const DynamicStruct::Reader& value) {
  KJ_REQUIRE(!value.schema.getProto().getStruct().getIsGroup(),
             "Cannot form pointer to group type.");
  builder.setStruct(value.reader);
}